

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::load_graphicsmagick_external
          (CImg<unsigned_char> *this,char *filename)

{
  int iVar1;
  int iVar2;
  FILE *pFVar3;
  char *pcVar4;
  CImgIOException *this_00;
  char cVar5;
  pointer_____offset_0x10___ *ppuVar6;
  uint uVar7;
  uint k;
  long lVar8;
  timeval st_time;
  char filetmp [512];
  char command [1024];
  
  if (filename == (char *)0x0) {
    this_00 = (CImgIOException *)__cxa_allocate_exception(0x4008);
    pcVar4 = "non-";
    if (this->_is_shared != false) {
      pcVar4 = "";
    }
    CImgArgumentException::CImgArgumentException
              ((CImgArgumentException *)this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_graphicsmagick_external() : Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar4,"unsigned char");
    ppuVar6 = &CImgArgumentException::typeinfo;
LAB_00152aab:
    __cxa_throw(this_00,ppuVar6,std::exception::~exception);
  }
  memset(command,0,0x400);
  memset(filetmp,0,0x200);
  if (cimg::graphicsmagick_path(char_const*,bool)::st_path == (char *)0x0) {
    pcVar4 = (char *)operator_new__(0x400);
    cimg::graphicsmagick_path(char_const*,bool)::st_path = pcVar4;
    memset(pcVar4 + 5,0,0x3fb);
    builtin_strncpy(pcVar4,"./gm",5);
    pFVar3 = fopen(pcVar4,"r");
    pcVar4 = cimg::graphicsmagick_path(char_const*,bool)::st_path;
    if (pFVar3 == (FILE *)0x0) {
      cimg::graphicsmagick_path(char_const*,bool)::st_path[2] = '\0';
      pcVar4[0] = 'g';
      pcVar4[1] = 'm';
    }
    else if ((_stdin != pFVar3) && (_stdout != pFVar3)) {
      uVar7 = fclose(pFVar3);
      if (uVar7 != 0) {
        cimg::warn("cimg::fclose() : Error code %d returned during file closing.",(ulong)uVar7);
      }
    }
  }
  snprintf(command,0x400,"%s convert \"%s\" pnm:-",
           cimg::graphicsmagick_path(char_const*,bool)::st_path,filename);
  pFVar3 = popen(command,"r");
  if (pFVar3 == (FILE *)0x0) {
    while( true ) {
      pcVar4 = cimg::temporary_path((char *)0x0,false);
      if (cimg::srand()::first_time == '\x01') {
        gettimeofday((timeval *)&st_time,(__timezone_ptr_t)0x0);
        uVar7 = (int)st_time.tv_sec * 1000 +
                ((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816(st_time.tv_usec),8) >> 7) -
                (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816(st_time.tv_usec),0xc) >> 0x1f));
        srand(uVar7);
        rand();
        rand();
        srand(uVar7);
        cimg::srand()::first_time = '\0';
      }
      lVar8 = 0;
      do {
        iVar1 = rand();
        iVar2 = rand();
        if (iVar1 % 3 == 0) {
          cVar5 = '0';
          iVar1 = 10;
        }
        else {
          if (iVar1 % 3 == 1) {
            cVar5 = 'a';
          }
          else {
            cVar5 = 'A';
          }
          iVar1 = 0x1a;
        }
        (&cimg::filenamerand()::randomid)[lVar8] = (char)(iVar2 % iVar1) + cVar5;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 8);
      snprintf(filetmp,0x200,"%s%c%s.pnm",pcVar4,0x2f,&cimg::filenamerand()::randomid);
      pFVar3 = fopen(filetmp,"rb");
      if (pFVar3 == (FILE *)0x0) break;
      if ((_stdin != pFVar3) && (_stdout != pFVar3)) {
        iVar1 = fclose(pFVar3);
        if (iVar1 != 0) {
          cimg::warn("cimg::fclose() : Error code %d returned during file closing.");
        }
      }
    }
    if (cimg::graphicsmagick_path(char_const*,bool)::st_path == (char *)0x0) {
      pcVar4 = (char *)operator_new__(0x400);
      cimg::graphicsmagick_path(char_const*,bool)::st_path = pcVar4;
      memset(pcVar4 + 5,0,0x3fb);
      builtin_strncpy(pcVar4,"./gm",5);
      pFVar3 = fopen(pcVar4,"r");
      pcVar4 = cimg::graphicsmagick_path(char_const*,bool)::st_path;
      if (pFVar3 == (FILE *)0x0) {
        cimg::graphicsmagick_path(char_const*,bool)::st_path[2] = '\0';
        pcVar4[0] = 'g';
        pcVar4[1] = 'm';
      }
      else if ((_stdin != pFVar3) && (_stdout != pFVar3)) {
        uVar7 = fclose(pFVar3);
        if (uVar7 != 0) {
          cimg::warn("cimg::fclose() : Error code %d returned during file closing.",(ulong)uVar7);
        }
      }
    }
    snprintf(command,0x400,"%s convert \"%s\" \"%s\"",
             cimg::graphicsmagick_path(char_const*,bool)::st_path,filename,filetmp);
    if (cimg::graphicsmagick_path(char_const*,bool)::st_path == (char *)0x0) {
      pcVar4 = (char *)operator_new__(0x400);
      cimg::graphicsmagick_path(char_const*,bool)::st_path = pcVar4;
      memset(pcVar4 + 5,0,0x3fb);
      builtin_strncpy(pcVar4,"./gm",5);
      pFVar3 = fopen(pcVar4,"r");
      pcVar4 = cimg::graphicsmagick_path(char_const*,bool)::st_path;
      if (pFVar3 == (FILE *)0x0) {
        cimg::graphicsmagick_path(char_const*,bool)::st_path[2] = '\0';
        pcVar4[0] = 'g';
        pcVar4[1] = 'm';
      }
      else if ((_stdin != pFVar3) && (_stdout != pFVar3)) {
        uVar7 = fclose(pFVar3);
        if (uVar7 != 0) {
          cimg::warn("cimg::fclose() : Error code %d returned during file closing.",(ulong)uVar7);
        }
      }
    }
    system(command);
    pFVar3 = fopen(filetmp,"rb");
    if (pFVar3 == (FILE *)0x0) {
      pFVar3 = cimg::fopen(filename,"r");
      cimg::fclose(pFVar3);
      this_00 = (CImgIOException *)__cxa_allocate_exception(0x4008);
      pcVar4 = "non-";
      if (this->_is_shared != false) {
        pcVar4 = "";
      }
      CImgIOException::CImgIOException
                (this_00,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_graphicsmagick_external() : Failed to load file \'%s\' with external command \'gm\'."
                 ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                 (ulong)this->_spectrum,this->_data,pcVar4,"unsigned char",filename);
      ppuVar6 = &CImgIOException::typeinfo;
      goto LAB_00152aab;
    }
    if ((_stdin != pFVar3) && (_stdout != pFVar3)) {
      iVar1 = fclose(pFVar3);
      if (iVar1 != 0) {
        cimg::warn("cimg::fclose() : Error code %d returned during file closing.");
      }
    }
    _load_pnm(this,(FILE *)0x0,filetmp);
    remove(filetmp);
  }
  else {
    _load_pnm(this,(FILE *)pFVar3,(char *)0x0);
    pclose(pFVar3);
  }
  return this;
}

Assistant:

CImg<T>& load_graphicsmagick_external(const char *const filename) {
      if (!filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_graphicsmagick_external() : Specified filename is (null).",
                                    cimg_instance);

      char command[1024] = { 0 }, filetmp[512] = { 0 };
      std::FILE *file = 0;
#if cimg_OS==1
      cimg_snprintf(command,sizeof(command),"%s convert \"%s\" pnm:-",cimg::graphicsmagick_path(),filename);
      file = popen(command,"r");
      if (file) {
        try { load_pnm(file); } catch (...) {
          pclose(file);
          throw CImgIOException(_cimg_instance
                                "load_graphicsmagick_external() : Failed to load file '%s' with external command 'gm'.",
                                cimg_instance,
                                filename);
        }
        pclose(file);
        return *this;
      }
#endif
      do {
        cimg_snprintf(filetmp,sizeof(filetmp),"%s%c%s.pnm",cimg::temporary_path(),cimg_file_separator,cimg::filenamerand());
        if ((file=std::fopen(filetmp,"rb"))!=0) cimg::fclose(file);
      } while (file);
      cimg_snprintf(command,sizeof(command),"%s convert \"%s\" \"%s\"",cimg::graphicsmagick_path(),filename,filetmp);
      cimg::system(command,cimg::graphicsmagick_path());
      if (!(file = std::fopen(filetmp,"rb"))) {
        cimg::fclose(cimg::fopen(filename,"r"));
        throw CImgIOException(_cimg_instance
                              "load_graphicsmagick_external() : Failed to load file '%s' with external command 'gm'.",
                              cimg_instance,
                              filename);

      } else cimg::fclose(file);
      load_pnm(filetmp);
      std::remove(filetmp);
      return *this;
    }